

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

cluster_config * __thiscall nuraft::raft_server::get_user_ctx_abi_cxx11_(raft_server *this)

{
  cluster_config *in_RDI;
  ptr<cluster_config> c_conf;
  raft_server *in_stack_ffffffffffffffd8;
  
  get_config(in_stack_ffffffffffffffd8);
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x153d18);
  cluster_config::get_user_ctx_abi_cxx11_(in_RDI);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x153d31);
  return in_RDI;
}

Assistant:

std::string raft_server::get_user_ctx() const {
    ptr<cluster_config> c_conf = get_config();
    return c_conf->get_user_ctx();
}